

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t duckdb::DecimalScaleUpOperator::Operation<long,duckdb::hugeint_t>
                    (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  hugeint_t hVar1;
  hugeint_t local_18;
  
  local_18 = Cast::Operation<long,duckdb::hugeint_t>(input);
  hVar1 = hugeint_t::operator*(&local_18,(hugeint_t *)((long)dataptr + 0x28));
  return hVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}